

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

Elem * new_ident(char *s,char *e,Rule *r)

{
  uint uVar1;
  Elem *elem;
  char *pcVar2;
  size_t sVar3;
  Elem *x;
  Rule *r_local;
  char *e_local;
  char *s_local;
  
  elem = new_elem();
  elem->kind = ELEM_UNRESOLVED;
  pcVar2 = dup_str(s,e);
  (elem->e).unresolved.string = pcVar2;
  sVar3 = strlen((elem->e).unresolved.string);
  (elem->e).unresolved.len = (uint)sVar3;
  elem->rule = r;
  if (r != (Rule *)0x0) {
    if ((r->elems).v == (Elem **)0x0) {
      (r->elems).v = (r->elems).e;
      uVar1 = (r->elems).n;
      (r->elems).n = uVar1 + 1;
      (r->elems).e[uVar1] = elem;
    }
    else {
      if ((r->elems).v == (r->elems).e) {
        if ((r->elems).n < 3) {
          uVar1 = (r->elems).n;
          (r->elems).n = uVar1 + 1;
          (r->elems).v[uVar1] = elem;
          return elem;
        }
      }
      else if (((r->elems).n & 7) != 0) {
        uVar1 = (r->elems).n;
        (r->elems).n = uVar1 + 1;
        (r->elems).v[uVar1] = elem;
        return elem;
      }
      vec_add_internal(&r->elems,elem);
    }
  }
  return elem;
}

Assistant:

Elem *new_ident(char *s, char *e, Rule *r) {
  Elem *x = new_elem();
  x->kind = ELEM_UNRESOLVED;
  x->e.unresolved.string = dup_str(s, e);
  x->e.unresolved.len = strlen(x->e.unresolved.string);
  x->rule = r;
  if (r) vec_add(&r->elems, x);
  return x;
}